

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool duckdb::Glob(char *string,idx_t slen,char *pattern,idx_t plen,bool allow_question_mark)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  idx_t iVar12;
  bool bVar13;
  bool bVar14;
  
  if (plen == 0 || slen == 0) {
    uVar7 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    uVar7 = 0;
    do {
      while( true ) {
        bVar2 = string[uVar10];
        bVar3 = pattern[uVar7];
        if (bVar3 < 0x5b) break;
        if (bVar3 != 0x5b) {
          if (bVar3 != 0x5c) goto LAB_009e07d9;
          uVar7 = uVar7 + 1;
          if (uVar7 == plen) {
            return false;
          }
          if (bVar2 != pattern[uVar7]) {
            return false;
          }
          goto LAB_009e07e1;
        }
LAB_009e0705:
        if (uVar7 + 1 == plen) {
          return false;
        }
        cVar4 = pattern[uVar7 + 1];
        iVar12 = uVar7 + 1;
        if (cVar4 == '!') {
          iVar12 = uVar7 + 2;
        }
        if (plen <= iVar12) {
          return false;
        }
        bVar13 = cVar4 == '!';
        bVar6 = !bVar13;
        uVar7 = iVar12;
        while (bVar3 = pattern[uVar7], bVar3 != 0x5d || uVar7 <= iVar12) {
          uVar8 = uVar7 + 1;
          if (uVar8 == plen) {
            return false;
          }
          if (pattern[uVar8] == '-') {
            if (uVar7 + 2 == plen) {
              return false;
            }
            bVar14 = (char)bVar2 <= pattern[uVar7 + 2] && (char)bVar3 <= (char)bVar2;
            uVar8 = uVar7 + 3;
          }
          else {
            bVar14 = bVar3 == bVar2;
          }
          bVar11 = bVar6;
          if (!bVar14) {
            bVar11 = bVar13;
          }
          if ((cVar4 == '!') != bVar13) {
            bVar11 = bVar13;
          }
          bVar13 = bVar11;
          uVar7 = uVar8;
          if (plen <= uVar8) {
            return false;
          }
        }
        if (bVar13 == false) {
          return false;
        }
        uVar7 = uVar7 + 1;
        uVar10 = uVar10 + 1;
        if ((slen <= uVar10) || (plen <= uVar7)) goto LAB_009e081f;
      }
      if (bVar3 == 0x3f) {
        if (allow_question_mark) goto LAB_009e07e1;
        goto LAB_009e0705;
      }
      if (bVar3 == 0x2a) {
        uVar8 = uVar7 + 1;
        if (uVar7 + 1 < plen) {
          uVar8 = plen;
        }
        goto LAB_009e084f;
      }
LAB_009e07d9:
      if (bVar2 != bVar3) {
        return false;
      }
LAB_009e07e1:
      uVar10 = uVar10 + 1;
      uVar7 = uVar7 + 1;
    } while ((uVar10 < slen) && (uVar7 < plen));
  }
LAB_009e081f:
  uVar8 = uVar7;
  if (uVar7 < plen) {
    do {
      uVar8 = uVar7;
      if (pattern[uVar7] != '*') break;
      uVar7 = uVar7 + 1;
      uVar8 = plen;
    } while (plen != uVar7);
  }
  return uVar10 == slen && uVar8 == plen;
  while (lVar5 = uVar7 + 1, uVar7 = uVar1, uVar9 = uVar1, pattern[lVar5] == '*') {
LAB_009e084f:
    uVar1 = uVar7 + 1;
    uVar9 = uVar8;
    if (plen <= uVar1) break;
  }
  if (plen - uVar9 == 0) {
    return true;
  }
  iVar12 = slen - uVar10;
  if (slen < uVar10 || iVar12 == 0) {
    return false;
  }
  do {
    bVar6 = Glob(string + uVar10,iVar12,pattern + uVar9,plen - uVar9,true);
    if (bVar6) {
      return bVar6;
    }
    uVar10 = uVar10 + 1;
    iVar12 = iVar12 - 1;
  } while (uVar10 < slen);
  return bVar6;
}

Assistant:

bool Glob(const char *string, idx_t slen, const char *pattern, idx_t plen, bool allow_question_mark) {
	idx_t sidx = 0;
	idx_t pidx = 0;
main_loop : {
	// main matching loop
	while (sidx < slen && pidx < plen) {
		char s = string[sidx];
		char p = pattern[pidx];
		switch (p) {
		case '*': {
			// asterisk: match any set of characters
			// skip any subsequent asterisks
			pidx++;
			while (pidx < plen && pattern[pidx] == '*') {
				pidx++;
			}
			// if the asterisk is the last character, the pattern always matches
			if (pidx == plen) {
				return true;
			}
			// recursively match the remainder of the pattern
			for (; sidx < slen; sidx++) {
				if (Glob(string + sidx, slen - sidx, pattern + pidx, plen - pidx)) {
					return true;
				}
			}
			return false;
		}
		case '?':
			// when enabled: matches anything but null
			if (allow_question_mark) {
				break;
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		case '[':
			pidx++;
			goto parse_bracket;
		case '\\':
			// escape character, next character needs to match literally
			pidx++;
			// check that we still have a character remaining
			if (pidx == plen) {
				return false;
			}
			p = pattern[pidx];
			if (s != p) {
				return false;
			}
			break;
		default:
			// not a control character: characters need to match literally
			if (s != p) {
				return false;
			}
			break;
		}
		sidx++;
		pidx++;
	}
	while (pidx < plen && pattern[pidx] == '*') {
		pidx++;
	}
	// we are finished only if we have consumed the full pattern
	return pidx == plen && sidx == slen;
}
parse_bracket : {
	// inside a bracket
	if (pidx == plen) {
		return false;
	}
	// check the first character
	// if it is an exclamation mark we need to invert our logic
	char p = pattern[pidx];
	char s = string[sidx];
	bool invert = false;
	if (p == '!') {
		invert = true;
		pidx++;
	}
	bool found_match = invert;
	idx_t start_pos = pidx;
	bool found_closing_bracket = false;
	// now check the remainder of the pattern
	while (pidx < plen) {
		p = pattern[pidx];
		// if the first character is a closing bracket, we match it literally
		// otherwise it indicates an end of bracket
		if (p == ']' && pidx > start_pos) {
			// end of bracket found: we are done
			found_closing_bracket = true;
			pidx++;
			break;
		}
		// we either match a range (a-b) or a single character (a)
		// check if the next character is a dash
		if (pidx + 1 == plen) {
			// no next character!
			break;
		}
		bool matches;
		if (pattern[pidx + 1] == '-') {
			// range! find the next character in the range
			if (pidx + 2 == plen) {
				break;
			}
			char next_char = pattern[pidx + 2];
			// check if the current character is within the range
			matches = s >= p && s <= next_char;
			// shift the pattern forward past the range
			pidx += 3;
		} else {
			// no range! perform a direct match
			matches = p == s;
			// shift the pattern forward past the character
			pidx++;
		}
		if (found_match == invert && matches) {
			// found a match! set the found_matches flag
			// we keep on pattern matching after this until we reach the end bracket
			// however, we don't need to update the found_match flag anymore
			found_match = !invert;
		}
	}
	if (!found_closing_bracket) {
		// no end of bracket: invalid pattern
		return false;
	}
	if (!found_match) {
		// did not match the bracket: return false;
		return false;
	}
	// finished the bracket matching: move forward
	sidx++;
	goto main_loop;
}
}